

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::chStOfLagrangian(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  ostream *poVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  
  bVar7 = true;
  for (iVar5 = 0; this->j = iVar5, iVar5 < this->numCol; iVar5 = iVar5 + 1) {
    dVar9 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] -
            (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5];
    piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = (long)piVar1[iVar5]; this->k = (int)lVar8, lVar8 < piVar1[(long)iVar5 + 1];
        lVar8 = lVar8 + 1) {
      dVar9 = dVar9 + pdVar3[piVar2[lVar8]] * pdVar4[lVar8];
    }
    if (this->tol <= ABS(dVar9) && ABS(dVar9) != this->tol) {
      if (this->print == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Column ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,(this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[this->j]);
        poVar6 = std::operator<<(poVar6," fails stationary of Lagrangian: dL/dx");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->j);
        std::operator<<(poVar6," = ");
        poVar6 = std::ostream::_M_insert<double>(dVar9);
        poVar6 = std::operator<<(poVar6,", rather than zero.");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar5 = this->j;
      }
      bVar7 = false;
    }
  }
  if (bVar7) {
    if (this->print == 1) {
      std::operator<<((ostream *)&std::cout,"Stationarity of Lagrangian.\n");
      return;
    }
  }
  else {
    if (this->print == 1) {
      std::operator<<((ostream *)&std::cout,"KKT check error: Lagrangian is not stationary.\n");
    }
    this->istrueGlb = true;
  }
  return;
}

Assistant:

void KktCheck::chStOfLagrangian() {
	bool istrue = true;
	double lagrV;
	//A'y + c - z = 0
	for (j=0; j<numCol;j++) {
		lagrV = colCost[j] -colDual[j];
		for (k=Astart[j]; k<Astart[j+1]; k++) 
				lagrV = lagrV + rowDual[Aindex[k]]*Avalue[k];
				
		if (abs(lagrV) > tol) {
			if (print == 1) 
				cout<<"Column "<<cIndexRev[j]<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
				//cout<<"Column "<<j<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
			istrue = false;
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Stationarity of Lagrangian.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Lagrangian is not stationary.\n";
		istrueGlb = true;
	}

}